

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

int nni_listener_find(nni_listener **lp,uint32_t id)

{
  int iVar1;
  nni_listener *pnVar2;
  nni_listener *l;
  uint32_t id_local;
  nni_listener **lp_local;
  
  nni_mtx_lock(&listeners_lk);
  pnVar2 = (nni_listener *)nni_id_get(&listeners,(ulong)id);
  if (pnVar2 != (nni_listener *)0x0) {
    pnVar2->l_ref = pnVar2->l_ref + 1;
    *lp = pnVar2;
  }
  nni_mtx_unlock(&listeners_lk);
  iVar1 = 0;
  if (pnVar2 == (nni_listener *)0x0) {
    iVar1 = 0xc;
  }
  return iVar1;
}

Assistant:

int
nni_listener_find(nni_listener **lp, uint32_t id)
{
	nni_listener *l;

	nni_mtx_lock(&listeners_lk);
	if ((l = nni_id_get(&listeners, id)) != NULL) {
		l->l_ref++;
		*lp = l;
	}
	nni_mtx_unlock(&listeners_lk);
	return (l == NULL ? NNG_ENOENT : 0);
}